

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_valence_decoder.h
# Opt level: O2

bool __thiscall
draco::MeshEdgebreakerTraversalValenceDecoder::Start
          (MeshEdgebreakerTraversalValenceDecoder *this,DecoderBuffer *out_buffer)

{
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *this_00;
  char *pcVar1;
  int64_t iVar2;
  int64_t iVar3;
  uint8_t *puVar4;
  size_t sVar5;
  undefined1 uVar6;
  bool bVar7;
  uint16_t uVar8;
  long lVar9;
  ulong uVar10;
  int8_t mode;
  uint32_t num_symbols;
  uint32_t num_split_symbols;
  value_type_conflict1 local_34;
  
  uVar8 = MeshEdgebreakerTraversalDecoder::BitstreamVersion
                    (&this->super_MeshEdgebreakerTraversalDecoder);
  if ((((0x201 < uVar8) ||
       (bVar7 = MeshEdgebreakerTraversalDecoder::DecodeTraversalSymbols
                          (&this->super_MeshEdgebreakerTraversalDecoder), bVar7)) &&
      (bVar7 = MeshEdgebreakerTraversalDecoder::DecodeStartFaces
                         (&this->super_MeshEdgebreakerTraversalDecoder), bVar7)) &&
     (bVar7 = MeshEdgebreakerTraversalDecoder::DecodeAttributeSeams
                        (&this->super_MeshEdgebreakerTraversalDecoder), bVar7)) {
    uVar6 = (this->super_MeshEdgebreakerTraversalDecoder).buffer_.field_0x31;
    uVar8 = (this->super_MeshEdgebreakerTraversalDecoder).buffer_.bitstream_version_;
    out_buffer->bit_mode_ = (this->super_MeshEdgebreakerTraversalDecoder).buffer_.bit_mode_;
    out_buffer->field_0x31 = uVar6;
    out_buffer->bitstream_version_ = uVar8;
    pcVar1 = (this->super_MeshEdgebreakerTraversalDecoder).buffer_.data_;
    iVar2 = (this->super_MeshEdgebreakerTraversalDecoder).buffer_.data_size_;
    iVar3 = (this->super_MeshEdgebreakerTraversalDecoder).buffer_.pos_;
    puVar4 = (this->super_MeshEdgebreakerTraversalDecoder).buffer_.bit_decoder_.bit_buffer_;
    sVar5 = (this->super_MeshEdgebreakerTraversalDecoder).buffer_.bit_decoder_.bit_offset_;
    (out_buffer->bit_decoder_).bit_buffer_end_ =
         (this->super_MeshEdgebreakerTraversalDecoder).buffer_.bit_decoder_.bit_buffer_end_;
    (out_buffer->bit_decoder_).bit_offset_ = sVar5;
    out_buffer->pos_ = iVar3;
    (out_buffer->bit_decoder_).bit_buffer_ = puVar4;
    out_buffer->data_ = pcVar1;
    out_buffer->data_size_ = iVar2;
    uVar8 = MeshEdgebreakerTraversalDecoder::BitstreamVersion
                      (&this->super_MeshEdgebreakerTraversalDecoder);
    if (uVar8 < 0x202) {
      uVar8 = MeshEdgebreakerTraversalDecoder::BitstreamVersion
                        (&this->super_MeshEdgebreakerTraversalDecoder);
      if (uVar8 < 0x200) {
        bVar7 = DecoderBuffer::Decode<unsigned_int>(out_buffer,&num_split_symbols);
      }
      else {
        bVar7 = DecodeVarint<unsigned_int>(&num_split_symbols,out_buffer);
      }
      if (bVar7 == false) {
        return false;
      }
      if ((uint)this->num_vertices_ <= num_split_symbols) {
        return false;
      }
      bVar7 = DecoderBuffer::Decode<signed_char>(out_buffer,&mode);
      if (!bVar7) {
        return false;
      }
      if (mode != '\0') {
        return false;
      }
    }
    this->min_valence_ = 2;
    this->max_valence_ = 7;
    if (-1 < (long)this->num_vertices_) {
      local_34 = 0;
      std::vector<int,_std::allocator<int>_>::resize
                (&(this->vertex_valences_).vector_,(long)this->num_vertices_,&local_34);
      this_00 = &this->context_symbols_;
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::resize(this_00,(long)((this->max_valence_ - this->min_valence_) + 1));
      std::vector<int,_std::allocator<int>_>::resize
                (&this->context_counters_,
                 ((long)(this->context_symbols_).
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->context_symbols_).
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x18);
      lVar9 = 0;
      uVar10 = 0;
      while( true ) {
        if ((ulong)(((long)(this->context_symbols_).
                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->context_symbols_).
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= uVar10) {
          return true;
        }
        bVar7 = DecodeVarint<unsigned_int>(&num_symbols,out_buffer);
        if ((!bVar7) ||
           ((uint)((ulong)((long)(this->corner_table_->corner_to_vertex_map_).vector_.
                                 super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->corner_table_->corner_to_vertex_map_).vector_.
                                 super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 2) / 3) < num_symbols)
           ) break;
        if ((ulong)num_symbols != 0) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     ((long)&(((this_00->
                               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl.super__Vector_impl_data + lVar9),(ulong)num_symbols);
          DecodeSymbols(num_symbols,1,out_buffer,
                        *(uint32_t **)
                         ((long)&(((this_00->
                                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data + lVar9));
          (this->context_counters_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar10] = num_symbols;
        }
        uVar10 = uVar10 + 1;
        lVar9 = lVar9 + 0x18;
      }
    }
  }
  return false;
}

Assistant:

bool Start(DecoderBuffer *out_buffer) {
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
    if (BitstreamVersion() < DRACO_BITSTREAM_VERSION(2, 2)) {
      if (!MeshEdgebreakerTraversalDecoder::DecodeTraversalSymbols()) {
        return false;
      }
    }
#endif
    if (!MeshEdgebreakerTraversalDecoder::DecodeStartFaces()) {
      return false;
    }
    if (!MeshEdgebreakerTraversalDecoder::DecodeAttributeSeams()) {
      return false;
    }
    *out_buffer = *buffer();

#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
    if (BitstreamVersion() < DRACO_BITSTREAM_VERSION(2, 2)) {
      uint32_t num_split_symbols;
      if (BitstreamVersion() < DRACO_BITSTREAM_VERSION(2, 0)) {
        if (!out_buffer->Decode(&num_split_symbols)) {
          return false;
        }
      } else {
        if (!DecodeVarint(&num_split_symbols, out_buffer)) {
          return false;
        }
      }
      if (num_split_symbols >= static_cast<uint32_t>(num_vertices_)) {
        return false;
      }

      int8_t mode;
      if (!out_buffer->Decode(&mode)) {
        return false;
      }
      if (mode == EDGEBREAKER_VALENCE_MODE_2_7) {
        min_valence_ = 2;
        max_valence_ = 7;
      } else {
        // Unsupported mode.
        return false;
      }

    } else
#endif
    {
      min_valence_ = 2;
      max_valence_ = 7;
    }

    if (num_vertices_ < 0) {
      return false;
    }
    // Set the valences of all initial vertices to 0.
    vertex_valences_.resize(num_vertices_, 0);

    const int num_unique_valences = max_valence_ - min_valence_ + 1;

    // Decode all symbols for all contexts.
    context_symbols_.resize(num_unique_valences);
    context_counters_.resize(context_symbols_.size());
    for (int i = 0; i < context_symbols_.size(); ++i) {
      uint32_t num_symbols;
      if (!DecodeVarint<uint32_t>(&num_symbols, out_buffer)) {
        return false;
      }
      if (num_symbols > static_cast<uint32_t>(corner_table_->num_faces())) {
        return false;
      }
      if (num_symbols > 0) {
        context_symbols_[i].resize(num_symbols);
        DecodeSymbols(num_symbols, 1, out_buffer, context_symbols_[i].data());
        // All symbols are going to be processed from the back.
        context_counters_[i] = num_symbols;
      }
    }
    return true;
  }